

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
::reject(AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
         *this,Exception *exception)

{
  undefined1 local_1f8 [472];
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1f8[0] = true;
    local_1f8._8_8_ = (exception->ownFile).content.ptr;
    local_1f8._16_8_ = (exception->ownFile).content.size_;
    local_1f8._24_8_ = (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_1f8._32_8_ = exception->file;
    local_1f8._40_4_ = exception->line;
    local_1f8._44_4_ = exception->type;
    local_1f8._48_8_ = (exception->description).content.ptr;
    local_1f8._56_8_ = (exception->description).content.size_;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_1f8._64_8_ = (exception->description).content.disposer;
    local_1f8._72_8_ = (exception->context).ptr.disposer;
    local_1f8._80_8_ = (exception->context).ptr.ptr;
    local_1f8._88_8_ = (exception->remoteTrace).content.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    local_1f8._96_8_ = (exception->remoteTrace).content.size_;
    local_1f8._104_8_ = (exception->remoteTrace).content.disposer;
    (exception->remoteTrace).content.ptr = (char *)0x0;
    (exception->remoteTrace).content.size_ = 0;
    memcpy(local_1f8 + 0x70,exception->trace,0x105);
    local_1f8._376_8_ = (exception->details).builder.ptr;
    local_1f8._384_8_ = (exception->details).builder.pos;
    local_1f8._392_8_ = (exception->details).builder.endPtr;
    local_1f8._400_8_ = (exception->details).builder.disposer;
    (exception->details).builder.endPtr = (Detail *)0x0;
    (exception->details).builder.ptr = (Detail *)0x0;
    (exception->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1f8[0x198] = false;
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=
              (&this->result,(ExceptionOr<kj::HttpClient::WebSocketResponse> *)local_1f8);
    if (local_1f8[0x198] == true) {
      OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
      ::destroy((OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
                 *)(local_1f8 + 0x1c0));
    }
    if (local_1f8[0] == true) {
      Exception::~Exception((Exception *)(local_1f8 + 8));
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }